

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O1

int Fxch_SCHashTableRemove
              (Fxch_SCHashTable_t *pSCHashTable,Vec_Wec_t *vCubes,uint32_t SubCubeID,uint32_t iCube,
              uint32_t iLit0,uint32_t iLit1,char fUpdate)

{
  Fxch_SCHashTable_Entry_t *pFVar1;
  ushort uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint32_t *puVar11;
  Fxch_SubCube_t *pSCData0;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  Fxch_SubCube_t *pSCData1;
  ulong uVar20;
  int local_74;
  
  uVar7 = (SubCubeID * -0x3361d2af >> 0x11 | SubCubeID * 0x16a88000) * 0x1b873593 ^ 0x9747b28c;
  uVar7 = (uVar7 << 0xd | uVar7 >> 0x13) * 5 + 0xe6546b64;
  uVar7 = (uVar7 >> 0x10 ^ uVar7 ^ 4) * -0x7a143595;
  uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
  uVar7 = (uVar7 >> 0x10 ^ uVar7) & pSCHashTable->SizeMask;
  pFVar1 = pSCHashTable->pBins + uVar7;
  uVar7 = *(uint *)&pSCHashTable->pBins[uVar7].field_0x8;
  uVar8 = uVar7 & 0xffff;
  uVar17 = (ulong)(uVar7 & 0xffff);
  if ((short)uVar7 != 0) {
    if ((uVar7 & 0xffff) == 1) {
      uVar7 = uVar7 & 0xffff0000;
      local_74 = 0;
      goto LAB_004bdbe9;
    }
    puVar11 = &pFVar1->vSCData->iCube;
    uVar17 = 0;
    do {
      if (*puVar11 == iCube) goto LAB_004bd835;
      uVar17 = uVar17 + 1;
      puVar11 = puVar11 + 3;
    } while (uVar8 != uVar17);
    uVar17 = (ulong)uVar8;
  }
LAB_004bd835:
  if ((uVar8 == 0) || ((uint)uVar17 == uVar8)) {
    __assert_fail("( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchSCHashTable.c"
                  ,300,
                  "int Fxch_SCHashTableRemove(Fxch_SCHashTable_t *, Vec_Wec_t *, uint32_t, uint32_t, uint32_t, uint32_t, char)"
                 );
  }
  uVar16 = uVar17 & 0xffffffff;
  if (*(short *)&pFVar1->field_0x8 == 0) {
    local_74 = 0;
    uVar2 = 0;
  }
  else {
    pSCData0 = pFVar1->vSCData + uVar16;
    uVar20 = 0;
    local_74 = 0;
    do {
      if (uVar20 != uVar16) {
        iVar9 = pSCHashTable->pFxchMan->nSizeOutputID;
        uVar7 = pSCData0->iCube * iVar9;
        if ((int)uVar7 < 0) {
LAB_004bdbfd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        pVVar3 = pSCHashTable->pFxchMan->vOutputID;
        iVar13 = pVVar3->nSize;
        if (iVar13 <= (int)uVar7) goto LAB_004bdbfd;
        pSCData1 = pFVar1->vSCData + uVar20;
        uVar8 = iVar9 * pSCData1->iCube;
        if (((int)uVar8 < 0) || (iVar13 <= (int)uVar8)) goto LAB_004bdbfd;
        piVar4 = pVVar3->pArray;
        if (*(uint *)&pSCData0->field_0x8 < 0x10000) {
LAB_004bd8fc:
          if (0xffff < *(uint *)&pSCData1->field_0x8) goto LAB_004bda22;
        }
        else {
          if (*(uint *)&pSCData1->field_0x8 < 0x10000) goto LAB_004bda22;
          if (*(uint *)&pSCData0->field_0x8 < 0x10000) goto LAB_004bd8fc;
        }
        iVar9 = Fxch_SCHashTableEntryCompare(pSCHashTable,vCubes,pSCData0,pSCData1);
        if ((((iVar9 != 0) && (*(short *)&pSCData0->field_0x8 != 0)) &&
            (*(short *)&pSCData1->field_0x8 != 0)) &&
           (iVar9 = Fxch_DivCreate(pSCHashTable->pFxchMan,pSCData1,pSCData0), -1 < iVar9)) {
          lVar10 = (long)pSCHashTable->pFxchMan->nSizeOutputID;
          if (lVar10 < 1) {
            iVar13 = 0;
          }
          else {
            lVar14 = 0;
            iVar13 = 0;
            do {
              uVar12 = piVar4[(ulong)uVar8 + lVar14] & piVar4[(ulong)uVar7 + lVar14];
              uVar12 = (uVar12 >> 1 & 0x55555555) + (uVar12 & 0x55555555);
              uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333);
              uVar12 = (uVar12 >> 4 & 0x7070707) + (uVar12 & 0x7070707);
              uVar12 = (uVar12 >> 8 & 0xf000f) + (uVar12 & 0xf000f);
              iVar13 = (uVar12 >> 0x10) + iVar13 + (uVar12 & 0xffff);
              lVar14 = lVar14 + 1;
            } while (lVar10 != lVar14);
          }
          if (iVar13 == 0) {
            uVar7 = 0xffffffff;
          }
          else {
            do {
              uVar7 = Fxch_DivRemove(pSCHashTable->pFxchMan,(int)fUpdate,0,iVar9);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          if (((int)uVar7 < 0) ||
             (pVVar5 = pSCHashTable->pFxchMan->vDivCubePairs, pVVar5->nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar6 = pVVar5->pArray;
          pVVar3 = pVVar6 + uVar7;
          iVar9 = pVVar6[uVar7].nSize;
          if (1 < iVar9) {
            piVar4 = pVVar3->pArray;
            uVar15 = 0;
            piVar19 = piVar4 + 1;
            do {
              if (((piVar4[uVar15] == pSCData1->iCube) && (piVar4[uVar15 + 1] == pSCData0->iCube))
                 || ((piVar4[uVar15] == pSCData0->iCube && (piVar4[uVar15 + 1] == pSCData1->iCube)))
                 ) {
                uVar18 = uVar15 | 1;
                pVVar3->nSize = iVar9 + -1;
                if ((long)uVar18 < (long)(iVar9 + -1)) {
                  do {
                    piVar4[uVar18] = (piVar4 + 1)[uVar18];
                    uVar18 = uVar18 + 1;
                  } while ((int)uVar18 < pVVar3->nSize);
                }
                if ((long)pVVar3->nSize <= (long)uVar15) {
                  __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
                }
                lVar10 = (long)pVVar3->nSize + -1;
                pVVar3->nSize = (int)lVar10;
                if ((long)uVar15 < lVar10) {
                  lVar10 = 0;
                  do {
                    piVar19[lVar10 + -1] = piVar19[lVar10];
                    lVar10 = lVar10 + 1;
                  } while ((int)lVar10 + (int)uVar15 < pVVar3->nSize);
                }
              }
              uVar15 = uVar15 + 2;
              iVar9 = pVVar3->nSize;
              piVar19 = piVar19 + 2;
            } while ((int)((uint)uVar15 | 1) < iVar9);
          }
          if (iVar9 == 0) {
            if (pVVar3->pArray != (int *)0x0) {
              free(pVVar3->pArray);
              pVVar3->pArray = (int *)0x0;
            }
            pVVar3->nCap = 0;
            pVVar3->nSize = 0;
          }
          local_74 = local_74 + 1;
        }
      }
LAB_004bda22:
      uVar20 = uVar20 + 1;
      uVar2 = *(ushort *)&pFVar1->field_0x8;
    } while (uVar20 < uVar2);
  }
  memmove(pFVar1->vSCData + uVar16,pFVar1->vSCData + uVar16 + 1,
          (long)(int)(~(uint)uVar17 + (uint)uVar2) * 0xc);
  uVar7 = *(uint *)&pFVar1->field_0x8 & 0xffff0000 | *(uint *)&pFVar1->field_0x8 - 1 & 0xffff;
LAB_004bdbe9:
  *(uint *)&pFVar1->field_0x8 = uVar7;
  return local_74;
}

Assistant:

int Fxch_SCHashTableRemove( Fxch_SCHashTable_t* pSCHashTable,
                            Vec_Wec_t* vCubes,
                            uint32_t SubCubeID,
                            uint32_t iCube,
                            uint32_t iLit0,
                            uint32_t iLit1,
                            char fUpdate )
{
    int iEntry;
    int Pairs = 0;
    uint32_t BinID;
    Fxch_SCHashTable_Entry_t* pBin;
    Fxch_SubCube_t* pEntry;
    int idx;

    MurmurHash3_x86_32( ( void* ) &SubCubeID, sizeof( int ), 0x9747b28c, &BinID);

    pBin = Fxch_SCHashTableBin( pSCHashTable, BinID );

    if ( pBin->Size == 1 )
    {
        pBin->Size = 0;
        return 0;
    }

    for ( iEntry = 0; iEntry < (int)pBin->Size; iEntry++ )
        if ( pBin->vSCData[iEntry].iCube == iCube )
            break;

    assert( ( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 ) );

    pEntry = &( pBin->vSCData[iEntry] );
    for ( idx = 0; idx < (int)pBin->Size; idx++ )
    if ( idx != iEntry )
    {
        int Base,
            iDiv = -1;

        int i, z,
            iCube0,
            iCube1;

        Fxch_SubCube_t* pNextEntry = &( pBin->vSCData[idx] );
        Vec_Int_t* vDivCubePairs;
        int* pOutputID0 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int* pOutputID1 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pNextEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int Result = 0;

        if ( (pEntry->iLit1 != 0 && pNextEntry->iLit1 == 0) || (pEntry->iLit1 == 0 && pNextEntry->iLit1 != 0)  )
            continue;

        if ( !Fxch_SCHashTableEntryCompare( pSCHashTable, vCubes, pEntry, pNextEntry )
             || pEntry->iLit0 == 0
             || pNextEntry->iLit0 == 0 )
            continue;

        Base = Fxch_DivCreate( pSCHashTable->pFxchMan, pNextEntry, pEntry );

        if ( Base < 0 )
            continue;

        for ( i = 0; i < pSCHashTable->pFxchMan->nSizeOutputID; i++ )
            Result += Fxch_CountOnes( pOutputID0[i] & pOutputID1[i] );

        for ( z = 0; z < Result; z++ )
            iDiv = Fxch_DivRemove( pSCHashTable->pFxchMan, fUpdate, 0, Base );

        vDivCubePairs = Vec_WecEntry( pSCHashTable->pFxchMan->vDivCubePairs, iDiv );
        Vec_IntForEachEntryDouble( vDivCubePairs, iCube0, iCube1, i )
            if ( ( iCube0 == (int)pNextEntry->iCube && iCube1 == (int)pEntry->iCube )  ||
                 ( iCube0 == (int)pEntry->iCube && iCube1 == (int)pNextEntry->iCube ) )
            {
                Vec_IntDrop( vDivCubePairs, i+1 );
                Vec_IntDrop( vDivCubePairs, i );
            }
        if ( Vec_IntSize( vDivCubePairs ) == 0 )
            Vec_IntErase( vDivCubePairs );

        Pairs++;
    }

    memmove(pBin->vSCData + iEntry, pBin->vSCData + iEntry + 1, (pBin->Size - iEntry - 1) * sizeof(*pBin->vSCData));
    pBin->Size -= 1;

    return Pairs;
}